

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O0

vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_> *
__thiscall
tonk::SDKConnectionList<MyServerConnection>::GetList(SDKConnectionList<MyServerConnection> *this)

{
  size_type sVar1;
  allocator_type *__a;
  shared_ptr<MyServerConnection> *in_RSI;
  mutex_type *in_RDI;
  uint i;
  uint count;
  lock_guard<std::mutex> locker;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *result;
  mutex_type *this_00;
  undefined1 *__n;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *in_stack_ffffffffffffffc0;
  uint local_30;
  undefined1 local_1e;
  undefined1 local_1d;
  uint local_1c;
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,in_RDI);
  sVar1 = std::
          vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
          ::size((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                  *)&in_RSI[2].super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  local_1c = (uint)sVar1;
  local_1d = 0;
  __a = (allocator_type *)(sVar1 & 0xffffffff);
  __n = &local_1e;
  std::allocator<std::shared_ptr<MyServerConnection>_>::allocator
            ((allocator<std::shared_ptr<MyServerConnection>_> *)0x10c2ad);
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::vector(in_stack_ffffffffffffffc0,(size_type)__n,__a);
  std::allocator<std::shared_ptr<MyServerConnection>_>::~allocator
            ((allocator<std::shared_ptr<MyServerConnection>_> *)0x10c2cd);
  for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
    std::
    vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
    ::operator[]((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                  *)&in_RSI[2].super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(ulong)local_30);
    std::static_pointer_cast<MyServerConnection,tonk::SDKConnection>
              ((shared_ptr<tonk::SDKConnection> *)this_00);
    std::
    vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
    ::operator[]((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                  *)this_00,(ulong)local_30);
    std::shared_ptr<MyServerConnection>::operator=(in_RSI,(shared_ptr<MyServerConnection> *)in_RDI);
    std::shared_ptr<MyServerConnection>::~shared_ptr((shared_ptr<MyServerConnection> *)0x10c327);
  }
  local_1d = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c378);
  return (vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
          *)in_RDI;
}

Assistant:

std::vector< std::shared_ptr<T> > GetList()
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);

        const unsigned count = static_cast<unsigned>(ConnectionList.size());
        std::vector< std::shared_ptr<T> > result(count);

        for (unsigned i = 0; i < count; ++i)
            result[i] = std::static_pointer_cast<T, SDKConnection>(ConnectionList[i]);

        return result;
    }